

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

void Map_MappingCuts(Map_Man_t *p)

{
  int nItemsTotal;
  Map_Node_t *p_00;
  int iVar1;
  uint uVar2;
  abctime aVar3;
  ProgressBar *p_01;
  Map_CutTable_t *p_02;
  abctime aVar4;
  abctime clk;
  int i;
  int nNodes;
  int nCuts;
  Map_Node_t *pNode;
  Map_CutTable_t *pTable;
  ProgressBar *pProgress;
  Map_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  if ((p->nVarsMax < 2) || (6 < p->nVarsMax)) {
    __assert_fail("p->nVarsMax > 1 && p->nVarsMax < 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                  ,0xb4,"void Map_MappingCuts(Map_Man_t *)");
  }
  for (clk._4_4_ = 0; clk._4_4_ < p->nInputs; clk._4_4_ = clk._4_4_ + 1) {
    Map_MappingCutsInput(p,p->pInputs[clk._4_4_]);
  }
  nItemsTotal = p->vMapObjs->nSize;
  p_01 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  p_02 = Map_CutTableStart(p);
  clk._4_4_ = 0;
  do {
    if (nItemsTotal <= clk._4_4_) {
      Extra_ProgressBarStop(p_01);
      Map_CutTableStop(p_02);
      if (p->fVerbose != 0) {
        uVar2 = Map_MappingCountAllCuts(p);
        printf("Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ",
               (double)((float)(int)uVar2 / (float)p->nNodes),(ulong)(uint)p->nNodes,
               (ulong)(uint)p->nVarsMax,(ulong)uVar2);
        Abc_Print(1,"%s =","Time");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
      }
      return;
    }
    p_00 = p->vMapObjs->pArray[clk._4_4_];
    iVar1 = Map_NodeIsBuf(p_00);
    if (iVar1 == 0) {
      iVar1 = Map_NodeIsAnd(p_00);
      if (iVar1 != 0) {
        Map_CutCompute(p,p_02,p_00);
        goto LAB_0042744a;
      }
    }
    else {
      Map_MappingCutsInput(p,p_00);
LAB_0042744a:
      Extra_ProgressBarUpdate(p_01,clk._4_4_,"Cuts ...");
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

void Map_MappingCuts( Map_Man_t * p )
{
    ProgressBar * pProgress;
    Map_CutTable_t * pTable;
    Map_Node_t * pNode;
    int nCuts, nNodes, i;
    abctime clk = Abc_Clock();
    // set the elementary cuts for the PI variables
    assert( p->nVarsMax > 1 && p->nVarsMax < 7 );
    for ( i = 0; i < p->nInputs; i++ )
        Map_MappingCutsInput( p, p->pInputs[i] );

    // compute the cuts for the internal nodes
    nNodes = p->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    pTable = Map_CutTableStart( p );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
        if ( Map_NodeIsBuf(pNode) )
            Map_MappingCutsInput( p, pNode );
        else if ( Map_NodeIsAnd(pNode) )
            Map_CutCompute( p, pTable, pNode );
        else continue;
        Extra_ProgressBarUpdate( pProgress, i, "Cuts ..." );
    }
    Extra_ProgressBarStop( pProgress );
    Map_CutTableStop( pTable );

    // report the stats
    if ( p->fVerbose )
    {
        nCuts = Map_MappingCountAllCuts(p);
        printf( "Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ", 
               p->nNodes, p->nVarsMax, nCuts, ((float)nCuts)/p->nNodes );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // print the cuts for the first primary output
//    Map_CutListPrint( p, Map_Regular(p->pOutputs[0]) );
}